

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O2

void __thiscall
pstore::command_line::
help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::usage
          (help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  string *psVar5;
  _List_node_base *p_Var6;
  
  poVar3 = std::operator<<((ostream *)this->outs_,"USAGE: ");
  std::operator<<(poVar3,(string *)&this->program_name_);
  bVar1 = has_switches(this);
  if (bVar1) {
    std::operator<<((ostream *)this->outs_," [options]");
  }
  p_Var4 = (_List_node_base *)option::all_abi_cxx11_();
  p_Var6 = p_Var4;
  while (p_Var6 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != p_Var4) {
    this_00 = (help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)p_Var6[1]._M_next;
    if (this_00 != this) {
      iVar2 = (*(this_00->super_option)._vptr_option[9])(this_00);
      if ((char)iVar2 != '\0') {
        poVar3 = std::operator<<((ostream *)this->outs_," ");
        psVar5 = option::usage_abi_cxx11_((option *)this_00);
        std::operator<<(poVar3,(string *)psVar5);
      }
    }
  }
  std::operator<<((ostream *)this->outs_,'\n');
  return;
}

Assistant:

void help<OutputStream>::usage () const {
            outs_ << ostream_traits::out_text ("USAGE: ")
                  << ostream_traits::out_string (program_name_);
            if (this->has_switches ()) {
                outs_ << ostream_traits::out_text (" [options]");
            }
            for (option const * const op : option::all ()) {
                if (op != this && op->is_positional ()) {
                    outs_ << ostream_traits::out_text (" ")
                          << ostream_traits::out_string (op->usage ());
                }
            }
            outs_ << '\n';
        }